

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcm2835.c
# Opt level: O1

int bcm2835_i2c_begin(void)

{
  int iVar1;
  uint *puVar2;
  float fVar3;
  
  iVar1 = 0;
  if (bcm2835_bsc1 != (uint32_t *)0xffffffffffffffff &&
      bcm2835_bsc0 != (uint32_t *)0xffffffffffffffff) {
    puVar2 = bcm2835_bsc1 + 5;
    bcm2835_peri_set_bits(bcm2835_gpio,0x100,0x1c0);
    bcm2835_peri_set_bits(bcm2835_gpio,0x800,0xe00);
    if (debug == '\0') {
      fVar3 = (float)(*puVar2 & 0xffff);
    }
    else {
      printf("bcm2835_peri_read  paddr %p\n",puVar2);
      fVar3 = 0.0;
    }
    i2c_byte_wait_us = (int)((fVar3 / 2.5e+08) * 1e+06 * 9.0);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int bcm2835_i2c_begin(void)
{
    uint16_t cdiv;

    if (   bcm2835_bsc0 == MAP_FAILED
	|| bcm2835_bsc1 == MAP_FAILED)
      return 0; /* bcm2835_init() failed, or not root */

#ifdef I2C_V1
    volatile uint32_t* paddr = bcm2835_bsc0 + BCM2835_BSC_DIV/4;
    /* Set the I2C/BSC0 pins to the Alt 0 function to enable I2C access on them */
    bcm2835_gpio_fsel(RPI_GPIO_P1_03, BCM2835_GPIO_FSEL_ALT0); /* SDA */
    bcm2835_gpio_fsel(RPI_GPIO_P1_05, BCM2835_GPIO_FSEL_ALT0); /* SCL */
#else
    volatile uint32_t* paddr = bcm2835_bsc1 + BCM2835_BSC_DIV/4;
    /* Set the I2C/BSC1 pins to the Alt 0 function to enable I2C access on them */
    bcm2835_gpio_fsel(RPI_V2_GPIO_P1_03, BCM2835_GPIO_FSEL_ALT0); /* SDA */
    bcm2835_gpio_fsel(RPI_V2_GPIO_P1_05, BCM2835_GPIO_FSEL_ALT0); /* SCL */
#endif    

    /* Read the clock divider register */
    cdiv = bcm2835_peri_read(paddr);
    /* Calculate time for transmitting one byte
    // 1000000 = micros seconds in a second
    // 9 = Clocks per byte : 8 bits + ACK
    */
    i2c_byte_wait_us = ((float)cdiv / BCM2835_CORE_CLK_HZ) * 1000000 * 9;

    return 1;
}